

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveOrderByTermToExprList(Parse *pParse,Select *pSelect,Expr *pE)

{
  int iVar1;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  u8 savedSuppErr;
  int rc;
  sqlite3 *db;
  ExprList *pEList;
  int i;
  NameContext nc;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  undefined4 uVar3;
  Parse *pParse_00;
  NameContext *pNC;
  int local_64;
  int local_44;
  undefined1 local_40 [8];
  undefined8 local_38;
  NameContext *local_30;
  undefined4 local_1c;
  undefined4 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_40,0xaa,0x38);
  uVar2 = CONCAT13(0xaa,(int3)in_stack_ffffffffffffff80);
  pNC = *(NameContext **)(in_RSI + 0x20);
  memset(local_40,0,0x38);
  local_38 = *(undefined8 *)(in_RSI + 0x28);
  local_18 = 0x80081;
  local_1c = 0;
  pParse_00 = (Parse *)*in_RDI;
  uVar2 = CONCAT13(*(undefined1 *)((long)&pParse_00->pIdxPartExpr + 3),(int3)uVar2);
  *(undefined1 *)((long)&pParse_00->pIdxPartExpr + 3) = 1;
  local_30 = pNC;
  iVar1 = sqlite3ResolveExprNames(pNC,(Expr *)pParse_00);
  *(char *)((long)&pParse_00->pIdxPartExpr + 3) = (char)((uint)uVar2 >> 0x18);
  if (iVar1 == 0) {
    uVar3 = 0;
    for (local_64 = 0; local_64 < *(int *)&pNC->pParse; local_64 = local_64 + 1) {
      iVar1 = sqlite3ExprCompare(pParse_00,(Expr *)CONCAT44(uVar3,uVar2),
                                 (Expr *)CONCAT44(in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78),0);
      if (iVar1 < 2) {
        local_44 = local_64 + 1;
        goto LAB_001e31aa;
      }
    }
    local_44 = 0;
  }
  else {
    local_44 = 0;
  }
LAB_001e31aa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

static int resolveOrderByTermToExprList(
  Parse *pParse,     /* Parsing context for error messages */
  Select *pSelect,   /* The SELECT statement with the ORDER BY clause */
  Expr *pE           /* The specific ORDER BY term */
){
  int i;             /* Loop counter */
  ExprList *pEList;  /* The columns of the result set */
  NameContext nc;    /* Name context for resolving pE */
  sqlite3 *db;       /* Database connection */
  int rc;            /* Return code from subprocedures */
  u8 savedSuppErr;   /* Saved value of db->suppressErr */

  assert( sqlite3ExprIsInteger(pE, &i, 0)==0 );
  pEList = pSelect->pEList;

  /* Resolve all names in the ORDER BY term expression
  */
  memset(&nc, 0, sizeof(nc));
  nc.pParse = pParse;
  nc.pSrcList = pSelect->pSrc;
  nc.uNC.pEList = pEList;
  nc.ncFlags = NC_AllowAgg|NC_UEList|NC_NoSelect;
  nc.nNcErr = 0;
  db = pParse->db;
  savedSuppErr = db->suppressErr;
  db->suppressErr = 1;
  rc = sqlite3ResolveExprNames(&nc, pE);
  db->suppressErr = savedSuppErr;
  if( rc ) return 0;

  /* Try to match the ORDER BY expression against an expression
  ** in the result set.  Return an 1-based index of the matching
  ** result-set entry.
  */
  for(i=0; i<pEList->nExpr; i++){
    if( sqlite3ExprCompare(0, pEList->a[i].pExpr, pE, -1)<2 ){
      return i+1;
    }
  }

  /* If no match, return 0. */
  return 0;
}